

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cali::StringConverter::to_stringlist_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,StringConverter *this,char *separators,bool *okptr)

{
  char c_00;
  byte bVar1;
  ulong uVar2;
  undefined7 uVar3;
  bool local_1fb;
  undefined1 local_1e0 [8];
  string str;
  istringstream local_1b0 [8];
  istringstream is;
  char c;
  bool *okptr_local;
  char *separators_local;
  StringConverter *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  bVar1 = (byte)okptr;
  uVar3 = (undefined7)((ulong)okptr >> 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)this,_S_in);
  do {
    util::read_word_abi_cxx11_
              ((string *)local_1e0,(util *)local_1b0,(istream *)separators,
               (char *)CONCAT71(uVar3,bVar1));
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_1e0);
    }
    c_00 = util::read_char((istream *)local_1b0);
    std::__cxx11::string::~string((string *)local_1e0);
    bVar1 = std::ios::good();
    local_1fb = false;
    if ((bVar1 & 1) != 0) {
      local_1fb = util::is_one_of(c_00,separators);
    }
  } while (local_1fb != false);
  if (okptr != (bool *)0x0) {
    *okptr = true;
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cali::StringConverter::to_stringlist(const char* separators, bool* okptr) const
{
    std::vector<std::string> ret;
    char                     c;

    std::istringstream is(m_str);

    do {
        std::string str = util::read_word(is, separators);

        if (!str.empty())
            ret.push_back(str);

        c = util::read_char(is);
    } while (is.good() && util::is_one_of(c, separators));

    if (okptr)
        *okptr = true;

    return ret;
}